

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O2

void __thiscall adios2::transport::FileHTTP::~FileHTTP(FileHTTP *this)

{
  ~FileHTTP(this);
  operator_delete(this);
  return;
}

Assistant:

FileHTTP::~FileHTTP()
{
    if (m_IsOpen)
    {
    }
}